

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<double,unsigned_long,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,
                 unsigned_long *Xc_ind,unsigned_long *Xc_indptr,MissingAction missing_action)

{
  unsigned_long *puVar1;
  ulong *puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  long lVar10;
  ulong *puVar11;
  unsigned_long uVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble lVar16;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar17;
  longdouble lVar18;
  longdouble local_110;
  longdouble local_104;
  longdouble local_f8;
  longdouble local_ec;
  ulong local_d8;
  long local_98;
  ushort uStack_90;
  long local_88;
  ushort uStack_80;
  
  uVar12 = Xc_indptr[col_num];
  uVar3 = Xc_indptr[col_num + 1];
  if ((uVar12 == uVar3) || (uVar7 = (end - st) + 1, uVar7 < 2)) {
    return -INFINITY;
  }
  puVar1 = Xc_ind + uVar3;
  uVar4 = puVar1[-1];
  puVar11 = ix_arr + end + 1;
  puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (ix_arr + st,puVar11,Xc_ind + uVar12);
  if (missing_action == Fail) {
    local_110 = (longdouble)0;
    local_104 = local_110;
    local_f8 = local_110;
    local_ec = local_110;
    do {
      puVar2 = Xc_ind + uVar12;
      while( true ) {
        if (((puVar8 == puVar11) || (uVar12 == uVar3)) || (uVar5 = *puVar8, uVar4 < uVar5))
        goto LAB_0021350a;
        if (*puVar2 == uVar5) break;
        if (*puVar2 <= uVar5) goto LAB_002134cc;
        puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar8 + 1,puVar11,puVar2);
      }
      local_110 = local_110 + (longdouble)Xc[uVar12];
      lVar13 = in_ST5;
      lVar15 = in_ST5;
      fmal();
      fmal();
      lVar14 = lVar15;
      fmal();
      local_104 = in_ST0;
      local_f8 = in_ST1;
      local_ec = in_ST2;
      if ((puVar8 == ix_arr + end) || (uVar12 == uVar3 - 1)) goto LAB_0021350a;
      puVar8 = puVar8 + 1;
      in_ST0 = in_ST3;
      in_ST1 = in_ST4;
      in_ST2 = in_ST5;
      in_ST3 = lVar13;
      in_ST4 = lVar15;
      in_ST5 = lVar14;
LAB_002134cc:
      puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar2 + 1,puVar1,puVar8);
      uVar12 = (long)puVar9 - (long)Xc_ind >> 3;
    } while( true );
  }
  local_110 = (longdouble)0;
  local_104 = local_110;
  local_f8 = local_110;
  local_ec = local_110;
  local_d8 = uVar7;
  do {
    puVar2 = Xc_ind + uVar12;
LAB_002131f3:
    if (((puVar8 == puVar11) || (uVar12 == uVar3)) || (uVar5 = *puVar8, uVar4 < uVar5)) {
LAB_00213379:
      lVar10 = uVar7 - Xc_indptr[col_num + 1];
      uVar7 = local_d8;
      if (local_d8 <= lVar10 + Xc_indptr[col_num]) {
        return -INFINITY;
      }
LAB_0021350a:
      if (uVar7 < 2) {
        return -INFINITY;
      }
      if ((local_104 == (longdouble)0) && (!NAN(local_104) && !NAN((longdouble)0))) {
        return -INFINITY;
      }
      if ((local_104 == local_110 * local_110) && (!NAN(local_104) && !NAN(local_110 * local_110)))
      {
        return -INFINITY;
      }
      lVar13 = (longdouble)(long)uVar7 + (longdouble)(float)(&DAT_003250d8)[(long)uVar7 < 0];
      lVar14 = local_110 / lVar13;
      lVar15 = lVar14 * lVar14;
      lVar16 = local_104 / lVar13 - lVar15;
      if (NAN(lVar16)) {
        return -INFINITY;
      }
      if ((lVar16 <= (longdouble)2.220446e-16) &&
         (bVar6 = check_more_than_two_unique_values<double,unsigned_long>
                            (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar6)) {
        return -INFINITY;
      }
      if (lVar16 <= (longdouble)0) {
        return 0.0;
      }
      lVar13 = (lVar15 * lVar14 * lVar14 * lVar13 +
               local_110 * (longdouble)-4.0 * lVar15 * lVar14 +
               local_104 * (longdouble)6.0 * lVar15 +
               local_ec + local_f8 * (longdouble)-4.0 * lVar14) / (lVar16 * lVar16 * lVar13);
      uStack_90 = (ushort)((unkuint10)lVar13 >> 0x40);
      local_98 = SUB108(lVar13,0);
      if (((unkuint10)lVar13 & 0x7fff) != 0 &&
          (0x7ffd < (ushort)((uStack_90 & 0x7fff) - 1) || -1 < local_98)) {
        return -INFINITY;
      }
      if (0.0 < (double)lVar13) {
        return (double)lVar13;
      }
      return 0.0;
    }
    if (*puVar2 != uVar5) {
      if (*puVar2 <= uVar5) goto LAB_00213346;
      puVar8 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar8 + 1,puVar11,puVar2);
      goto LAB_002131f3;
    }
    lVar13 = (longdouble)Xc[uVar12];
    local_88 = SUB108(lVar13,0);
    uStack_80 = (ushort)((unkuint10)lVar13 >> 0x40);
    if ((NAN(Xc[uVar12])) || ((~uStack_80 & 0x7fff) == 0 && local_88 == -0x8000000000000000)) {
      local_d8 = local_d8 - 1;
      lVar13 = in_ST0;
      lVar14 = in_ST1;
      lVar15 = in_ST2;
    }
    else {
      local_110 = local_110 + lVar13;
      lVar16 = in_ST5;
      lVar17 = in_ST5;
      fmal();
      fmal();
      lVar18 = lVar17;
      fmal();
      lVar13 = in_ST3;
      lVar14 = in_ST4;
      lVar15 = in_ST5;
      in_ST3 = lVar16;
      in_ST4 = lVar17;
      in_ST5 = lVar18;
      local_104 = in_ST0;
      local_f8 = in_ST1;
      local_ec = in_ST2;
    }
    if ((puVar8 == ix_arr + end) || (uVar12 == uVar3 - 1)) goto LAB_00213379;
    puVar8 = puVar8 + 1;
    in_ST0 = lVar13;
    in_ST1 = lVar14;
    in_ST2 = lVar15;
LAB_00213346:
    puVar9 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                       (puVar2 + 1,puVar1,puVar8);
    uVar12 = (long)puVar9 - (long)Xc_ind >> 3;
  } while( true );
}

Assistant:

double calc_kurtosis(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                     real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     MissingAction missing_action)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    size_t cnt = end - st + 1;

    if (unlikely(cnt <= 1)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt--;
                }

                else
                {
                    /* TODO: is it safe to use FMA here? some calculations rely on assuming that
                       some of these 's' are larger than the others. Would this procedure be guaranteed
                       to preserve such differences if done with a mixture of sums and FMAs? */
                    x_sq = square(xval);
                    s1 += xval;
                    s2  = std::fma(xval, xval, s2);
                    s3  = std::fma(x_sq, xval, s3);
                    s4  = std::fma(x_sq, x_sq, s4);
                    // s1 += pw1(xval);
                    // s2 += pw2(xval);
                    // s3 += pw3(xval);
                    // s4 += pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= (end - st + 1) - (Xc_indptr[col_num+1] - Xc_indptr[col_num]))) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                xval = Xc[curr_pos];
                x_sq = square(xval);
                s1 += xval;
                s2  = std::fma(xval, xval, s2);
                s3  = std::fma(x_sq, xval, s3);
                s4  = std::fma(x_sq, x_sq, s4);
                // s1 += pw1(xval);
                // s2 += pw2(xval);
                // s3 += pw3(xval);
                // s4 += pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    ldouble_safe sn = s1 / cnt_l;
    ldouble_safe v  = s2 / cnt_l - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt_l * pw4(sn)) / (cnt_l * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}